

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cws.c
# Opt level: O2

void nn_cws_shutdown(nn_fsm *self,int src,int type,void *srcptr)

{
  int iVar1;
  
  if (type == -3 && src == -2) {
    iVar1 = nn_sws_isidle((nn_sws *)(self + 0xb));
    if (iVar1 == 0) {
      nn_ep_stat_increment((nn_ep *)self[1].shutdown_fn,0x67,1);
      nn_sws_stop((nn_sws *)(self + 0xb));
    }
    *(undefined4 *)&self[1].fn = 10;
  }
  else {
    if (*(int *)&self[1].fn == 0xb) goto LAB_00124c27;
    if (*(int *)&self[1].fn != 10) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
              (ulong)*(uint *)&self[1].fn,(ulong)(uint)src,(ulong)(uint)type,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/transports/ws/cws.c"
              ,0x143);
      fflush(_stderr);
      nn_err_abort();
    }
  }
  iVar1 = nn_sws_isidle((nn_sws *)(self + 0xb));
  if (iVar1 == 0) {
    return;
  }
  nn_backoff_stop((nn_backoff *)&self[8].shutdown_fn);
  nn_usock_stop((nn_usock *)&self[1].state);
  nn_dns_stop((nn_dns *)&self[0x52].stopped.item);
  *(undefined4 *)&self[1].fn = 0xb;
LAB_00124c27:
  iVar1 = nn_backoff_isidle((nn_backoff *)&self[8].shutdown_fn);
  if (((iVar1 != 0) && (iVar1 = nn_usock_isidle((nn_usock *)&self[1].state), iVar1 != 0)) &&
     (iVar1 = nn_dns_isidle((nn_dns *)&self[0x52].stopped.item), iVar1 != 0)) {
    *(undefined4 *)&self[1].fn = 1;
    nn_fsm_stopped_noevent(self);
    nn_ep_stopped((nn_ep *)self[1].shutdown_fn);
    return;
  }
  return;
}

Assistant:

static void nn_cws_shutdown (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_cws *cws;

    cws = nn_cont (self, struct nn_cws, fsm);

    if (nn_slow (src == NN_FSM_ACTION && type == NN_FSM_STOP)) {
        if (!nn_sws_isidle (&cws->sws)) {
            nn_ep_stat_increment (cws->ep, NN_STAT_DROPPED_CONNECTIONS, 1);
            nn_sws_stop (&cws->sws);
        }
        cws->state = NN_CWS_STATE_STOPPING_SWS_FINAL;
    }
    if (nn_slow (cws->state == NN_CWS_STATE_STOPPING_SWS_FINAL)) {
        if (!nn_sws_isidle (&cws->sws))
            return;
        nn_backoff_stop (&cws->retry);
        nn_usock_stop (&cws->usock);
        nn_dns_stop (&cws->dns);
        cws->state = NN_CWS_STATE_STOPPING;
    }
    if (nn_slow (cws->state == NN_CWS_STATE_STOPPING)) {
        if (!nn_backoff_isidle (&cws->retry) ||
              !nn_usock_isidle (&cws->usock) ||
              !nn_dns_isidle (&cws->dns))
            return;
        cws->state = NN_CWS_STATE_IDLE;
        nn_fsm_stopped_noevent (&cws->fsm);
        nn_ep_stopped (cws->ep);
        return;
    }

    nn_fsm_bad_state (cws->state, src, type);
}